

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldStringAccessor::Swap
          (RepeatedPtrFieldStringAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  int iVar1;
  long lVar2;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *value;
  int iVar3;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  RepeatedPtrFieldBase local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((RepeatedFieldAccessor *)this != other_mutator) {
    local_68.tagged_rep_or_elem_ = (void *)0x0;
    local_68.current_size_ = 0;
    local_68.capacity_proxy_ = 0;
    local_68.arena_ = (Arena *)0x0;
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Swap((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_68,
           (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)data);
    iVar1 = (**(code **)(*(long *)other_mutator + 8))(other_mutator,other_data);
    iVar3 = 0;
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    for (; iVar1 != iVar3; iVar3 = iVar3 + 1) {
      RepeatedFieldAccessor::Get<std::__cxx11::string>(&local_50,other_mutator,other_data,iVar3);
      RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                ((RepeatedFieldAccessor *)this,data,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    lVar2 = (**(code **)((long)*this + 0x80))(this,data);
    iVar1 = *(int *)(lVar2 + 8);
    (**(code **)(*(long *)other_mutator + 0x18))(other_mutator,other_data);
    iVar3 = 0;
    if (iVar1 < 1) {
      iVar1 = iVar3;
    }
    for (; iVar1 != iVar3; iVar3 = iVar3 + 1) {
      value = RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                        (&local_68,iVar3);
      RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                (other_mutator,other_data,value);
    }
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_68);
    return;
  }
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Swap((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)data,(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)other_data);
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    if (this == other_mutator) {
      MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
    } else {
      RepeatedPtrField<std::string> tmp;
      tmp.Swap(MutableRepeatedField(data));
      int other_size = other_mutator->Size(other_data);
      for (int i = 0; i < other_size; ++i) {
        Add<std::string>(data, other_mutator->Get<std::string>(other_data, i));
      }
      int size = Size(data);
      other_mutator->Clear(other_data);
      for (int i = 0; i < size; ++i) {
        other_mutator->Add<std::string>(other_data, tmp.Get(i));
      }
    }
  }